

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O0

void h264e_dpb_check(H264eDpb *dpb,EncCpbStatus *cpb)

{
  int iVar1;
  uint uVar2;
  H264eDpbFrm *pHVar3;
  H264eDpbFrm *pHVar4;
  char *pcVar5;
  uint local_5c;
  RK_S32 used_size;
  H264eDpbFrm *tmp_1;
  H264eDpbFrm *unref;
  RK_S32 small_poc;
  H264eDpbFrm *tmp;
  RK_S32 lt_idx;
  RK_S32 dpb_size;
  RK_S32 used_size_1;
  RK_S32 i;
  H264eDpbFrm *refr;
  H264eDpbFrm *curr;
  EncCpbStatus *cpb_local;
  H264eDpb *dpb_local;
  
  pHVar3 = dpb->curr;
  pHVar4 = dpb->refr;
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_check",dpb);
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","frm %d refr -> frm %d ready\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar4->seq_idx);
  }
  if (((pHVar3->status).val >> 6 & 1) == 0) {
    iVar1 = dpb->used_size;
    uVar2 = dpb->dpb_size;
    if ((h264e_debug & 0x100) != 0) {
      pcVar5 = "st";
      if (((pHVar3->status).val >> 7 & 1) != 0) {
        pcVar5 = "lt";
      }
      _mpp_log_l(4,"h264e_dpb","frm %d %s insert dpb used %d max %d\n","h264e_dpb_check",
                 (ulong)(uint)pHVar3->seq_idx,pcVar5,iVar1,uVar2);
    }
    lt_idx = iVar1 + 1;
    if (((pHVar3->status).val >> 7 & 1) == 0) {
      dpb->st_size = dpb->st_size + 1;
    }
    else {
      iVar1 = pHVar3->lt_idx;
      dpb->lt_size = dpb->lt_size + 1;
      for (dpb_size = 0; dpb_size < dpb->total_cnt; dpb_size = dpb_size + 1) {
        pHVar4 = dpb->frames + dpb_size;
        if (((pHVar4 != pHVar3) && (((uint)pHVar4->field_2 & 0xff) != 0)) &&
           (((pHVar4->status).val & 1) != 0)) {
          if ((((pHVar4->status).val >> 6 & 1) != 0) &&
             (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "!tmp->status.is_non_ref","h264e_dpb_check",0x282),
             (mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          if ((((pHVar4->status).val >> 7 & 1) != 0) && (pHVar4->lt_idx == iVar1)) {
            *(ushort *)&pHVar4->field_2 = *(ushort *)&pHVar4->field_2 & 0xff00;
            (pHVar4->status).val = (pHVar4->status).val & 0xfffffffffffffffe;
            if ((h264e_debug & 0x100) != 0) {
              _mpp_log_l(4,"h264e_dpb","frm %d lt_idx %d replace %d\n","h264e_dpb_check",
                         (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar3->lt_idx,pHVar4->slot_idx);
            }
            dpb->lt_size = dpb->lt_size + -1;
            lt_idx = lt_idx + -1;
          }
        }
      }
    }
    if ((int)uVar2 < lt_idx) {
      if (((int)uVar2 < dpb->lt_size) &&
         (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "dpb->lt_size <= dpb_size","h264e_dpb_check",0x295),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      for (; (int)uVar2 < lt_idx; lt_idx = lt_idx + -1) {
        unref._4_4_ = 0x7fffffff;
        tmp_1 = (H264eDpbFrm *)0x0;
        if ((h264e_debug & 0x100) != 0) {
          _mpp_log_l(4,"h264e_dpb","sliding window cpb proc: st %d lt %d max %d\n","h264e_dpb_check"
                     ,(ulong)(uint)dpb->st_size,(ulong)(uint)dpb->lt_size,uVar2);
        }
        for (dpb_size = 0; dpb_size < dpb->total_cnt; dpb_size = dpb_size + 1) {
          pHVar4 = dpb->frames + dpb_size;
          if ((h264e_debug & 0x100) != 0) {
            _mpp_log_l(4,"h264e_dpb","frm %d num %d poc %d\n","h264e_dpb_check",
                       (ulong)(uint)pHVar4->seq_idx,(ulong)(uint)pHVar4->frame_num,pHVar4->poc);
          }
          if (((pHVar4->as_pskip_ref == 0) && ((pHVar4->field_2).on_used != 0)) &&
             (((pHVar4->status).val & 1) != 0)) {
            if ((((pHVar4->status).val >> 6 & 1) != 0) &&
               (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "!tmp->status.is_non_ref","h264e_dpb_check",0x2ad),
               (mpp_debug & 0x10000000) != 0)) {
              abort();
            }
            if (((((pHVar4->status).val >> 7 & 1) == 0) && (pHVar4->poc < unref._4_4_)) &&
               (unref._4_4_ = pHVar4->poc, tmp_1 = pHVar4, (h264e_debug & 0x100) != 0)) {
              _mpp_log_l(4,"h264e_dpb","frm %d update smallest poc to %d\n","h264e_dpb_check",
                         (ulong)(uint)pHVar4->seq_idx,(ulong)(uint)pHVar4->poc);
            }
          }
        }
        if (tmp_1 == (H264eDpbFrm *)0x0) break;
        if ((h264e_debug & 0x100) != 0) {
          _mpp_log_l(4,"h264e_dpb","removing frm %d poc %d\n","h264e_dpb_check",
                     (ulong)(uint)tmp_1->seq_idx,(ulong)(uint)tmp_1->poc);
        }
        *(ushort *)&tmp_1->field_2 = *(ushort *)&tmp_1->field_2 & 0xff00;
        dpb->st_size = dpb->st_size + -1;
        if ((dpb->st_size < 0) &&
           (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "dpb->st_size >= 0","h264e_dpb_check",0x2c1), (mpp_debug & 0x10000000) != 0))
        {
          abort();
        }
      }
    }
    dpb->used_size = lt_idx;
    if ((((int)uVar2 < lt_idx) &&
        (_mpp_log_l(2,"h264e_dpb","error found used_size %d > dpb_size %d\n","h264e_dpb_check",
                    (ulong)(uint)lt_idx,(ulong)uVar2), (int)uVar2 < lt_idx)) &&
       (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "used_size <= dpb_size","h264e_dpb_check",0x2cb), (mpp_debug & 0x10000000) != 0))
    {
      abort();
    }
  }
  else {
    *(ushort *)&pHVar3->field_2 = *(ushort *)&pHVar3->field_2 & 0xff00;
    (pHVar3->status).val = (pHVar3->status).val & 0xfffffffffffffffe;
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d done used_size %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)dpb->used_size);
  }
  local_5c = 0;
  for (dpb_size = 0; dpb_size < 8; dpb_size = dpb_size + 1) {
    pHVar4 = find_cpb_frame(dpb,cpb->final + dpb_size);
    dpb->map[dpb_size] = pHVar4;
    if (dpb->map[dpb_size] != (H264eDpbFrm *)0x0) {
      local_5c = local_5c + 1;
    }
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d cpb final used_size %d vs %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)local_5c,dpb->used_size);
  }
  if ((dpb->used_size != local_5c) &&
     (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->used_size == used_size","h264e_dpb_check",0x2da),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_check",dpb);
  }
  return;
}

Assistant:

void h264e_dpb_check(H264eDpb *dpb, EncCpbStatus *cpb)
{
    H264eDpbFrm *curr = dpb->curr;
    H264eDpbFrm *refr = dpb->refr;
    RK_S32 i;

    h264e_dbg_dpb("enter %p\n", dpb);

    h264e_dbg_dpb("frm %d refr -> frm %d ready\n",
                  curr->seq_idx, refr->seq_idx);

    if (curr->status.is_non_ref) {
        curr->dpb_used = 0;
        curr->status.valid = 0;
    } else {
        /* sliding window process */
        RK_S32 used_size = dpb->used_size;
        RK_S32 dpb_size = dpb->dpb_size;

        h264e_dbg_dpb("frm %d %s insert dpb used %d max %d\n",
                      curr->seq_idx, curr->status.is_lt_ref ? "lt" : "st",
                      used_size, dpb_size);

        used_size++;

        /* replace lt ref with same lt_idx */
        if (curr->status.is_lt_ref) {
            RK_S32 lt_idx = curr->lt_idx;

            dpb->lt_size++;

            for (i = 0; i < dpb->total_cnt; i++) {
                H264eDpbFrm *tmp = &dpb->frames[i];

                if (tmp == curr)
                    continue;

                if (!tmp->dpb_used)
                    continue;

                if (!tmp->status.valid)
                    continue;

                mpp_assert(!tmp->status.is_non_ref);

                if (!tmp->status.is_lt_ref)
                    continue;

                if (tmp->lt_idx == lt_idx) {
                    tmp->dpb_used = 0;
                    tmp->status.valid = 0;
                    h264e_dbg_dpb("frm %d lt_idx %d replace %d\n",
                                  curr->seq_idx, curr->lt_idx, tmp->slot_idx);
                    dpb->lt_size--;
                    used_size--;
                }
            }
        } else {
            dpb->st_size++;
        }

        if (used_size > dpb_size) {
            mpp_assert(dpb->lt_size <= dpb_size);

            while (used_size > dpb_size) {
                RK_S32 small_poc = 0x7fffffff;
                H264eDpbFrm *unref = NULL;

                h264e_dbg_dpb("sliding window cpb proc: st %d lt %d max %d\n",
                              dpb->st_size, dpb->lt_size, dpb_size);

                for (i = 0; i < dpb->total_cnt; i++) {
                    H264eDpbFrm *tmp = &dpb->frames[i];

                    h264e_dbg_dpb("frm %d num %d poc %d\n",
                                  tmp->seq_idx, tmp->frame_num, tmp->poc);

                    if (tmp->as_pskip_ref)
                        continue;

                    if (!tmp->on_used)
                        continue;

                    if (!tmp->status.valid)
                        continue;

                    mpp_assert(!tmp->status.is_non_ref);

                    if (tmp->status.is_lt_ref)
                        continue;

                    if (tmp->poc < small_poc) {
                        unref = tmp;
                        small_poc = tmp->poc;

                        h264e_dbg_dpb("frm %d update smallest poc to %d\n",
                                      tmp->seq_idx, tmp->poc);
                    }
                }

                if (unref) {
                    h264e_dbg_dpb("removing frm %d poc %d\n",
                                  unref->seq_idx, unref->poc);

                    unref->dpb_used = 0;
                    dpb->st_size--;
                    mpp_assert(dpb->st_size >= 0);
                    used_size--;
                } else
                    break;
            }
        }

        dpb->used_size = used_size;
        if (used_size > dpb_size) {
            mpp_err_f("error found used_size %d > dpb_size %d\n", used_size, dpb_size);
            mpp_assert(used_size <= dpb_size);
        }
    }

    h264e_dbg_dpb("curr %d done used_size %d\n", curr->seq_idx, dpb->used_size);

    RK_S32 used_size = 0;
    for (i = 0; i < MAX_CPB_REFS; i++) {
        dpb->map[i] = find_cpb_frame(dpb, &cpb->final[i]);
        if (dpb->map[i])
            used_size++;
    }

    h264e_dbg_dpb("curr %d cpb final used_size %d vs %d\n",
                  curr->seq_idx, used_size, dpb->used_size);
    mpp_assert(dpb->used_size == used_size);

    h264e_dbg_dpb("leave %p\n", dpb);
}